

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::cubeb_async_logger(cubeb_async_logger *this)

{
  (this->sleep_for).tv_sec = 0;
  (this->sleep_for).tv_nsec = 10000000;
  ring_buffer_base<cubeb_log_message>::ring_buffer_base(&this->msg_queue,0x28);
  run(this);
  return;
}

Assistant:

cubeb_async_logger()
    : msg_queue(CUBEB_LOG_MESSAGE_QUEUE_DEPTH)
  {
    run();
  }